

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<long,_long_long,_17>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (long *lhs,longlong *rhs,longlong *result)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  lVar1 = *lhs;
  lVar2 = *rhs;
  lVar4 = lVar1 - lVar2;
  if (SBORROW8(lVar1,lVar2)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  if (lVar1 < 0) {
    bVar6 = -1 < lVar2;
    bVar5 = lVar1 < lVar4;
  }
  else {
    bVar6 = lVar2 < 0;
    bVar5 = lVar4 < lVar1;
  }
  if (!(bool)(bVar5 & bVar6)) {
    *result = lVar4;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs std::int64_t, rhs any signed int (including std::int64_t)
        std::int64_t tmp = lhs - rhs;

        // we have essentially 4 cases:
        //
        // 1) lhs positive, rhs positive - overflow not possible in tmp
        // 2) lhs positive, rhs negative - equivalent to addition - result >= lhs or error
        // 3) lhs negative, rhs positive - check result <= lhs
        // 4) lhs negative, rhs negative - overflow not possible in tmp

        if( lhs >= 0 )
        {
            // if both positive, overflow to negative not possible
            // which is why we'll explicitly check maxInt, and not call SafeCast
            if (subtract_corner_case_max< T, U, safeint_internal::int_traits< T >::isLT64Bit>::isOverflowPositive(rhs, lhs, tmp))
            {
                E::SafeIntOnOverflow();
            }
        }
        else
        {
            // lhs negative
            if (subtract_corner_case_max< T, U, safeint_internal::int_traits< T >::isLT64Bit >::isOverflowNegative(rhs, lhs, tmp))
            {
                E::SafeIntOnOverflow();
            }
        }

        result = (T)tmp;
    }